

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O2

void __thiscall chrono::fea::ChLinkPointTriface::ConstraintsLoadJacobians(ChLinkPointTriface *this)

{
  type_constraint_tuple_b *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_> *this_01;
  type_constraint_tuple_b *this_02;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined8 uVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined4 local_2f8;
  uint uStack_2f4;
  ChRowVectorRef local_2e8;
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_> *local_2c8;
  undefined8 uStack_2c0;
  double local_2b0;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_2a8;
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
  local_278;
  ChMatrix33<double> Jxb2;
  ChMatrix33<double> Jxb1;
  ChMatrix33<double> Jxb3;
  ChMatrix33<double> Jxa;
  
  auVar25 = in_ZMM8._0_16_;
  dVar9 = (1.0 - this->s2) - this->s3;
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            (&Jxa.super_Matrix<double,_3,_3,_1,_3,_3>);
  if ((this->d != 0.0) || (NAN(this->d))) {
    peVar4 = (this->mtriangle).mnodeB1.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar5 = (this->mtriangle).mnodeB2.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar6 = (this->mtriangle).mnodeB3.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x30;
    dVar2 = *(double *)&peVar6->field_0x30;
    dVar3 = *(double *)&peVar5->field_0x30;
    auVar28 = *(undefined1 (*) [16])&(peVar4->super_ChNodeFEAbase).field_0x20;
    auVar31 = vsubpd_avx(auVar28,*(undefined1 (*) [16])&(peVar6->super_ChNodeFEAbase).field_0x20);
    dVar36 = dVar1 - dVar2;
    dVar1 = dVar1 - dVar3;
    dVar3 = dVar3 - dVar2;
    local_2f8 = SUB84(dVar9,0);
    uStack_2f4 = (uint)((ulong)dVar9 >> 0x20);
    uStack_2c0 = 0;
    auVar32 = vsubpd_avx(auVar28,*(undefined1 (*) [16])&(peVar5->super_ChNodeFEAbase).field_0x20);
    auVar30 = vshufpd_avx(auVar31,auVar31,1);
    auVar24 = vshufpd_avx(auVar32,auVar32,1);
    dVar2 = auVar32._0_8_ * auVar30._0_8_ - auVar24._0_8_ * auVar31._0_8_;
    auVar33._8_8_ = 0x7fffffffffffffff;
    auVar33._0_8_ = 0x7fffffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar2;
    auVar23 = vandpd_avx(auVar41,auVar33);
    auVar29._0_8_ = auVar32._0_8_ * dVar36;
    auVar29._8_8_ = auVar32._8_8_ * dVar36;
    auVar15._0_8_ = auVar31._0_8_ * dVar1;
    auVar15._8_8_ = auVar31._8_8_ * dVar1;
    uVar49 = auVar25._8_8_;
    auVar29 = vsubpd_avx(auVar29,auVar15);
    auVar26 = vandpd_avx(auVar29,auVar33);
    auVar27 = vshufpd_avx(auVar29,auVar29,1);
    local_2b0 = auVar27._0_8_ * auVar27._0_8_ + dVar2 * dVar2 + auVar29._0_8_ * auVar29._0_8_;
    local_2c8 = (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_> *)dVar1;
    dVar34 = pow(local_2b0,1.5);
    auVar12._8_8_ = uVar49;
    auVar12._0_8_ = (double)(int)((uint)(0.0 < dVar2) - (uint)(dVar2 < 0.0));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar36;
    dVar2 = this->d;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar2;
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar15 = vmovddup_avx512vl(ZEXT816(0x3fe0000000000000));
    dVar34 = 1.0 / dVar34;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_2b0;
    auVar25 = vsqrtsd_avx(auVar25,auVar28);
    auVar16 = vshufps_avx512vl(auVar26,auVar26,0x4e);
    auVar17 = vxorpd_avx512vl(auVar55,auVar14);
    auVar18 = vmulsd_avx512f(auVar13,auVar16);
    auVar35._0_8_ = 1.0 / auVar25._0_8_;
    auVar35._8_8_ = 0;
    auVar33 = vsubpd_avx(*(undefined1 (*) [16])
                          &(((this->mtriangle).mnodeB2.
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ChNodeFEAbase).field_0x20,
                         *(undefined1 (*) [16])
                          &(((this->mtriangle).mnodeB3.
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ChNodeFEAbase).field_0x20);
    uVar10 = vcmppd_avx512vl(ZEXT816(0) << 0x40,auVar29,1);
    uVar11 = vcmppd_avx512vl(auVar29,ZEXT816(0) << 0x40,1);
    auVar25 = vpmovm2b_avx512vl(uVar11 & 3);
    auVar28 = vpmovm2b_avx512vl(uVar10 & 3);
    auVar25 = vpsubb_avx(auVar25,auVar28);
    auVar21._8_8_ = dVar3;
    auVar21._0_8_ = dVar3;
    auVar28 = vshufpd_avx(auVar33,auVar33,1);
    auVar25 = vpmovsxbd_avx(auVar25);
    auVar19 = vmulpd_avx512vl(auVar21,auVar26);
    auVar25 = vcvtdq2pd_avx(auVar25);
    auVar20 = vmulsd_avx512f(auVar23,auVar12);
    dVar7 = auVar25._0_8_;
    dVar38 = auVar19._0_8_ * dVar7;
    dVar40 = auVar19._8_8_ * auVar25._8_8_;
    auVar19 = vshufpd_avx(auVar25,auVar25,1);
    dVar51 = auVar19._0_8_;
    dVar8 = dVar51 * auVar18._0_8_;
    dVar36 = auVar20._0_8_ * auVar33._0_8_;
    dVar37 = auVar20._0_8_ * auVar33._8_8_;
    auVar22._0_8_ = dVar38 + dVar38;
    auVar22._8_8_ = dVar40 + dVar40;
    auVar18._0_8_ = dVar36 + dVar36;
    auVar18._8_8_ = dVar37 + dVar37;
    auVar19 = vshufpd_avx(auVar18,auVar18,1);
    auVar18 = vsubpd_avx(auVar19,auVar22);
    dVar40 = auVar19._0_8_ + auVar22._0_8_;
    auVar19 = vmulsd_avx512f(auVar26,auVar25);
    dVar36 = auVar19._0_8_ * auVar33._0_8_;
    dVar37 = dVar51 * auVar28._0_8_ * auVar16._0_8_;
    auVar19 = vshufpd_avx512vl(auVar18,auVar18,1);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar36 + dVar36;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar37 + dVar37;
    auVar20 = vaddsd_avx512f(auVar39,auVar20);
    auVar21 = vmulsd_avx512f(auVar30,auVar23);
    auVar22 = vmulsd_avx512f(auVar13,auVar26);
    auVar21 = vmulsd_avx512f(auVar21,auVar12);
    dVar36 = auVar22._0_8_ * dVar7;
    dVar36 = auVar21._0_8_ + auVar21._0_8_ + dVar36 + dVar36;
    auVar21 = vmulsd_avx512f(auVar31,auVar23);
    auVar23 = vmovddup_avx512vl(auVar23);
    auVar22 = vmulpd_avx512vl(auVar32,auVar23);
    auVar23 = vmulsd_avx512f(auVar21,auVar12);
    dVar38 = (auVar23._0_8_ + auVar23._0_8_) - (dVar8 + dVar8);
    auVar23 = vmulsd_avx512f(auVar31,auVar26);
    auVar21 = vmulsd_avx512f(auVar30,auVar16);
    dVar8 = auVar23._0_8_ * dVar7;
    dVar37 = dVar51 * auVar21._0_8_;
    dVar8 = dVar8 + dVar8 + dVar37 + dVar37;
    auVar16 = vmulsd_avx512f(auVar24,auVar16);
    auVar21 = vmulsd_avx512f(auVar32,auVar26);
    auVar23._8_8_ = dVar1;
    auVar23._0_8_ = dVar1;
    auVar23 = vmulpd_avx512vl(auVar26,auVar23);
    auVar24 = vmulsd_avx512f(auVar24,auVar55);
    dVar7 = auVar21._0_8_ * dVar7;
    dVar51 = dVar51 * auVar16._0_8_;
    dVar1 = dVar7 + dVar7 + dVar51 + dVar51;
    auVar25 = vmulpd_avx512vl(auVar23,auVar25);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar2 * auVar35._0_8_;
    auVar23 = vmulsd_avx512f(auVar33,auVar16);
    auVar26 = vmulsd_avx512f(auVar27,auVar55);
    auVar43._0_8_ = auVar25._0_8_ + auVar25._0_8_;
    auVar43._8_8_ = auVar25._8_8_ + auVar25._8_8_;
    dVar7 = dVar34 * auVar26._0_8_;
    auVar16 = ZEXT816(0x3fe0000000000000);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         dVar40 * dVar7 * 0.5 - dVar9;
    dVar2 = dVar3 * dVar2 * auVar35._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar7;
    auVar25 = vmulsd_avx512f(auVar45,auVar19);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar2;
    auVar26 = vxorpd_avx512vl(auVar53,auVar14);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar26._0_8_ - auVar25._0_8_ * 0.5;
    auVar25 = vmulsd_avx512f(auVar27,auVar17);
    auVar27 = vmulsd_avx512f(auVar28,auVar55);
    auVar28 = vmovddup_avx512vl(auVar29);
    dVar3 = dVar34 * auVar25._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar3;
    auVar25 = vmulsd_avx512f(auVar56,auVar20);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auVar25._0_8_ * 0.5;
    auVar25 = vfmadd231sd_avx512f(auVar52,auVar27,auVar35);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar3 * dVar1 * 0.5;
    auVar29 = vfmadd231sd_avx512f(auVar57,auVar24,auVar35);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar25._0_8_;
    auVar25 = vunpcklpd_avx512vl(auVar17,auVar55);
    auVar50._0_8_ = dVar34 * auVar28._0_8_ * auVar25._0_8_;
    auVar50._8_8_ = dVar34 * auVar28._8_8_ * auVar25._8_8_;
    auVar46._0_8_ = dVar40 * auVar50._0_8_;
    auVar46._8_8_ = auVar18._8_8_ * auVar50._8_8_;
    auVar25 = vmulpd_avx512vl(auVar46,auVar15);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         auVar25._0_8_ + dVar2;
    auVar26._8_4_ = local_2f8;
    auVar26._0_8_ = dVar9;
    auVar26._12_4_ = uStack_2f4;
    auVar25 = vsubpd_avx(auVar25,auVar26);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar25._8_8_;
    auVar28 = vshufpd_avx(auVar50,auVar50,1);
    auVar25 = vmulsd_avx512f(auVar28,auVar20);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auVar25._0_8_ * 0.5;
    auVar25 = vsubsd_avx512f(auVar47,auVar23);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar25._0_8_;
    auVar25 = vmulsd_avx512f(auVar41,auVar55);
    dVar2 = dVar34 * auVar25._0_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar40 * dVar2 * 0.5;
    auVar25 = vfnmadd231sd_avx512f(auVar58,auVar35,auVar27);
    auVar26 = vmulsd_avx512f(auVar30,auVar55);
    auVar26 = vmulsd_avx512f(auVar35,auVar26);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         auVar25._0_8_;
    auVar25 = vmulsd_avx512f(auVar41,auVar17);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar38;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar2;
    auVar30 = vmulsd_avx512f(auVar44,auVar48);
    dVar34 = dVar34 * auVar25._0_8_;
    auVar25 = vmulsd_avx512f(auVar30,auVar16);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar34;
    auVar30 = vmulsd_avx512f(auVar54,auVar19);
    auVar27 = vmulsd_avx512f(auVar31,auVar55);
    auVar19 = vfnmadd231sd_avx512f(auVar25,auVar35,auVar27);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = auVar30._0_8_ * 0.5;
    auVar25 = vaddsd_avx512f(auVar23,auVar59);
    auVar23 = vmulsd_avx512f(auVar13,auVar55);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar25._0_8_;
    auVar25 = vmulsd_avx512f(auVar48,auVar20);
    auVar30._8_4_ = local_2f8;
    auVar30._0_8_ = -dVar9;
    auVar30._12_4_ = uStack_2f4 ^ 0x80000000;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = auVar25._0_8_ * 0.5;
    auVar25 = vsubsd_avx512f(auVar30,auVar60);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar36;
    auVar30 = vmulsd_avx512f(auVar17,auVar28);
    Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar25._0_8_;
    auVar25 = vmulsd_avx512f(auVar30,auVar16);
    auVar30 = vfnmadd231sd_avx512f(auVar25,auVar35,auVar23);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar38 * dVar7 * 0.5;
    auVar23 = vfmadd231sd_avx512f(auVar61,auVar23,auVar35);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar8;
    auVar25 = vmulsd_avx512f(auVar42,auVar50);
    auVar25 = vmulsd_avx512f(auVar25,auVar16);
    auVar27 = vfmadd231sd_avx512f(auVar25,auVar27,auVar35);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_2c8;
    auVar25 = vmulsd_avx512f(auVar55,auVar25);
    auVar31 = vmulsd_avx512f(auVar32,auVar55);
    auVar32 = vmovddup_avx512vl(auVar12);
    auVar32 = vmulpd_avx512vl(auVar22,auVar32);
    dVar3 = auVar31._0_8_ * auVar35._0_8_;
    auVar31 = vaddpd_avx512vl(auVar32,auVar32);
    auVar31 = vshufpd_avx512vl(auVar31,auVar31,1);
    auVar32 = vaddpd_avx512vl(auVar31,auVar43);
    auVar33 = vmulsd_avx512f(auVar35,auVar25);
    auVar25 = vmulsd_avx512f(auVar32,auVar48);
    auVar25 = vmulsd_avx512f(auVar25,auVar16);
    auVar24 = vfnmadd231sd_avx512f(auVar25,auVar24,auVar35);
    auVar25 = vmulsd_avx512f(auVar17,auVar45);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = this->s2;
    auVar18 = vxorpd_avx512vl(auVar63,auVar14);
    auVar25 = vmulsd_avx512f(auVar25,auVar16);
    auVar25 = vsubsd_avx512f(auVar18,auVar25);
    Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar18._0_8_ - auVar28._0_8_ * dVar38 * 0.5;
    vmovsd_avx512f(auVar25);
    Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar23._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar8 * dVar7 * 0.5;
    auVar25 = vsubsd_avx512f(auVar62,auVar26);
    Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar25._0_8_;
    vmovsd_avx512f(auVar30);
    vmovsd_avx512f(auVar27);
    auVar23 = vsubpd_avx512vl(auVar31,auVar43);
    auVar25 = vshufpd_avx(auVar23,auVar23,1);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar34 * dVar36 * 0.5;
    auVar26 = vaddsd_avx512f(auVar26,auVar27);
    Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         auVar26._0_8_;
    vmovsd_avx512f(auVar19);
    auVar26 = vmulsd_avx512f(auVar32,auVar45);
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         dVar3 + dVar34 * auVar25._0_8_ * 0.5;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar2 * dVar8 * 0.5;
    auVar30 = vsubsd_avx512f(auVar19,auVar63);
    Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar30._0_8_;
    dVar9 = this->s3;
    auVar31._8_8_ = dVar9;
    auVar31._0_8_ = dVar9;
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar29._0_8_;
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         auVar26._0_8_ * 0.5 - dVar9;
    auVar26 = vxorpd_avx512vl(auVar33,auVar14);
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar26._0_8_ - auVar25._0_8_ * dVar7 * 0.5;
    auVar32._0_8_ = auVar50._0_8_ * auVar32._0_8_;
    auVar32._8_8_ = auVar50._8_8_ * auVar23._8_8_;
    auVar25 = vmulpd_avx512vl(auVar32,auVar15);
    auVar23 = vaddpd_avx512vl(auVar25,auVar33);
    auVar25 = vsubpd_avx(auVar25,auVar31);
    auVar26 = vxorpd_avx512vl(auVar31,auVar14);
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar25._8_8_;
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         auVar23._0_8_;
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar28._0_8_ * dVar1 * 0.5 - dVar3;
    Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar26._0_8_ - dVar2 * dVar1 * 0.5;
    vmovsd_avx512f(auVar24);
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jxb1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jxb2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jxb3);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::fillDiagonal
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jxb1,-dVar9);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::fillDiagonal
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jxb2,-this->s2);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::fillDiagonal
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jxb3,-this->s3);
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxa.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Get_Cq
            (&local_2e8,&(this->constraint1).tuple_a);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxa.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Get_Cq
            (&local_2e8,&(this->constraint2).tuple_a);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxa.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Get_Cq
            (&local_2e8,&(this->constraint3).tuple_a);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  local_2c8 = &(this->constraint1).tuple_b;
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_1
            (&local_2e8,local_2c8);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  this_00 = &(this->constraint2).tuple_b;
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_1
            (&local_2e8,this_00);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  this_02 = &(this->constraint3).tuple_b;
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_1
            (&local_2e8,this_02);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  this_01 = local_2c8;
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_2
            (&local_2e8,local_2c8);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_2
            (&local_2e8,this_00);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb2.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_2
            (&local_2e8,this_02);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_3
            (&local_2e8,this_01);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_3
            (&local_2e8,this_00);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_2a8,&Jxb3.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Get_Cq_3
            (&local_2e8,this_02);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_278,&local_2e8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_278.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_2a8);
  return;
}

Assistant:

void ChLinkPointTriface::ConstraintsLoadJacobians() {
    double s1 = 1 - s2 - s3;

    // compute jacobians
    ChMatrix33<> Jxa;
    Jxa.setIdentity();

    ChMatrix33<> Jxb1;
    ChMatrix33<> Jxb2;
    ChMatrix33<> Jxb3;

    if (d != 0) {
        double t2 = mtriangle.mnodeB1->pos.x() - mtriangle.mnodeB2->pos.x();
        double t3 = mtriangle.mnodeB1->pos.y() - mtriangle.mnodeB3->pos.y();
        double t4 = t2 * t3;
        double t5 = mtriangle.mnodeB1->pos.y() - mtriangle.mnodeB2->pos.y();
        double t6 = mtriangle.mnodeB1->pos.x() - mtriangle.mnodeB3->pos.x();
        double t12 = t5 * t6;
        double t7 = t4 - t12;
        double t8 = mtriangle.mnodeB1->pos.z() - mtriangle.mnodeB3->pos.z();
        double t9 = t2 * t8;
        double t10 = mtriangle.mnodeB1->pos.z() - mtriangle.mnodeB2->pos.z();
        double t14 = t6 * t10;
        double t11 = t9 - t14;
        double t13 = std::abs(t7);
        double t15 = std::abs(t11);
        double t16 = t5 * t8;
        double t22 = t3 * t10;
        double t17 = t16 - t22;
        double t18 = std::abs(t17);
        double t19 = mtriangle.mnodeB2->pos.z() - mtriangle.mnodeB3->pos.z();
        double t20 = std::pow(t13, 2);
        double t21 = std::pow(t15, 2);
        double t23 = std::pow(t18, 2);
        double t24 = t20 + t21 + t23;
        double t25 = mysgn(t7);
        double t26 = 1.0 / std::pow(t24, (3.0 / 2.0));
        double t27 = mtriangle.mnodeB2->pos.y() - mtriangle.mnodeB3->pos.y();
        double t28 = 1.0 / sqrt(t24);
        double t29 = mysgn(t11);
        double t30 = mtriangle.mnodeB2->pos.x() - mtriangle.mnodeB3->pos.x();
        double t31 = mysgn(t17);
        double t32 = d * t19 * t28;
        double t33 = t13 * t25 * t27 * 2.0;
        double t34 = t15 * t19 * t29 * 2.0;
        double t35 = t33 + t34;
        double t36 = t13 * t25 * t30 * 2.0;
        double t59 = t18 * t19 * t31 * 2.0;
        double t37 = t36 - t59;
        double t38 = t15 * t29 * t30 * 2.0;
        double t39 = t18 * t27 * t31 * 2.0;
        double t40 = t38 + t39;
        double t41 = t3 * t13 * t25 * 2.0;
        double t42 = t8 * t15 * t29 * 2.0;
        double t43 = t41 + t42;
        double t44 = t6 * t13 * t25 * 2.0;
        double t61 = t8 * t18 * t31 * 2.0;
        double t45 = t44 - t61;
        double t46 = t6 * t15 * t29 * 2.0;
        double t47 = t3 * t18 * t31 * 2.0;
        double t48 = t46 + t47;
        double t49 = d * t10 * t28;
        double t50 = t5 * t13 * t25 * 2.0;
        double t51 = t10 * t15 * t29 * 2.0;
        double t52 = t50 + t51;
        double t53 = t2 * t13 * t25 * 2.0;
        double t63 = t10 * t18 * t31 * 2.0;
        double t54 = t53 - t63;
        double t55 = t2 * t15 * t29 * 2.0;
        double t56 = t5 * t18 * t31 * 2.0;
        double t57 = t55 + t56;
        double t58 = d * t28 * t30;
        double t60 = d * t3 * t28;
        double t62 = d * t2 * t28;

        Jxb1(0, 0) = -s1 + (d * t17 * t26 * t35) / 2;
        Jxb1(0, 1) = -t32 - (d * t17 * t26 * t37) / 2;
        Jxb1(0, 2) = -(d * t17 * t26 * t40) / 2 + d * t27 * t28;
        Jxb1(1, 0) = -(d * t11 * t26 * t35) / 2 + t32;
        Jxb1(1, 1) = -s1 + (d * t11 * t26 * t37) / 2;
        Jxb1(1, 2) = -t58 + (d * t11 * t26 * t40) / 2;
        Jxb1(2, 0) = -d * t27 * t28 + (d * t7 * t26 * t35) / 2;
        Jxb1(2, 1) = -(d * t7 * t26 * t37) / 2 + t58;
        Jxb1(2, 2) = -s1 - (d * t7 * t26 * t40) / 2;

        Jxb2(0, 0) = -s2 - (d * t17 * t26 * t43) / 2;
        Jxb2(0, 1) = d * t8 * t28 + (d * t17 * t26 * t45) / 2;
        Jxb2(0, 2) = -t60 + (d * t17 * t26 * t48) / 2;
        Jxb2(1, 0) = -d * t8 * t28 + (d * t11 * t26 * t43) / 2, Jxb2(1, 1) = -s2 - (d * t11 * t26 * t45) / 2;
        Jxb2(1, 2) = -(d * t11 * t26 * t48) / 2 + d * t6 * t28;
        Jxb2(2, 0) = -(d * t7 * t26 * t43) / 2 + t60;
        Jxb2(2, 1) = -d * t6 * t28 + (d * t7 * t26 * t45) / 2;
        Jxb2(2, 2) = -s2 + (d * t7 * t26 * t48) / 2;

        Jxb3(0, 0) = -s3 + (d * t17 * t26 * t52) / 2;
        Jxb3(0, 1) = -t49 - (d * t17 * t26 * t54) / 2;
        Jxb3(0, 2) = -(d * t17 * t26 * t57) / 2 + d * t5 * t28;
        Jxb3(1, 0) = -(d * t11 * t26 * t52) / 2 + t49;
        Jxb3(1, 1) = -s3 + (d * t11 * t26 * t54) / 2;
        Jxb3(1, 2) = -t62 + (d * t11 * t26 * t57) / 2;
        Jxb3(2, 0) = -d * t5 * t28 + (d * t7 * t26 * t52) / 2;
        Jxb3(2, 1) = -(d * t7 * t26 * t54) / 2 + t62;
        Jxb3(2, 2) = -s3 - (d * t7 * t26 * t57) / 2;
    } else {
        // simplified jacobian when offset d = 0;
        Jxb1.setZero();
        Jxb2.setZero();
        Jxb3.setZero();
        Jxb1.fillDiagonal(-s1);
        Jxb2.fillDiagonal(-s2);
        Jxb3.fillDiagonal(-s3);
    }

    constraint1.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(0);
    constraint2.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(1);
    constraint3.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(2);

    constraint1.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(0);
    constraint2.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(1);
    constraint3.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(2);

    constraint1.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(0);
    constraint2.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(1);
    constraint3.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(2);

    constraint1.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(0);
    constraint2.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(1);
    constraint3.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(2);
}